

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjWhatFanin(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanin)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  
  if (pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff) == pFanin) {
    iVar1 = 0;
  }
  else if (pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) == pFanin) {
    iVar1 = 1;
  }
  else {
    pGVar2 = Gia_ObjFanin2(p,pObj);
    if (pGVar2 != pFanin) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ed,"int Gia_ObjWhatFanin(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static inline int          Gia_ObjWhatFanin( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanin )  { if ( Gia_ObjFanin0(pObj) == pFanin ) return 0; if ( Gia_ObjFanin1(pObj) == pFanin ) return 1; if ( Gia_ObjFanin2(p, pObj) == pFanin ) return 2; assert(0); return -1; }